

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void qtree_onebit64(LONGLONG *a,int n,int nx,int ny,uchar *b,int bit)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  bVar1 = (byte)bit;
  uVar15 = 2L << (bVar1 & 0x3f);
  uVar10 = 4L << (bVar1 & 0x3f);
  uVar11 = 8L << (bVar1 & 0x3f);
  iVar2 = n * 2;
  iVar3 = 0;
  uVar14 = 0;
  iVar9 = 0;
  while( true ) {
    lVar7 = (long)iVar3;
    lVar16 = (long)(int)uVar14;
    if (nx + -1 <= iVar9) break;
    lVar8 = lVar7 << 0x20;
    lVar12 = (long)n;
    lVar13 = lVar12 << 0x20;
    lVar17 = lVar16 << 0x20;
    lVar4 = 0;
    for (lVar6 = 0; (int)lVar6 < ny + -1; lVar6 = lVar6 + 2) {
      b[lVar4 + lVar16] =
           (uchar)((long)(a[lVar7 + lVar6] << 3 & uVar11 | a[lVar7 + lVar6 + 1] << 2 & uVar10 |
                         a[lVar12 + lVar6] * 2 & uVar15 |
                         a[lVar12 + lVar6 + 1] & 1L << (bVar1 & 0x3f)) >> (bVar1 & 0x3f));
      lVar8 = lVar8 + 0x200000000;
      lVar13 = lVar13 + 0x200000000;
      lVar17 = lVar17 + 0x100000000;
      lVar4 = lVar4 + 1;
    }
    if ((int)lVar6 < ny) {
      b[lVar17 >> 0x20] =
           (uchar)((long)(*(long *)((long)a + (lVar8 >> 0x1d)) << 3 & uVar11 |
                         *(long *)((long)a + (lVar13 >> 0x1d)) * 2 & uVar15) >> (bVar1 & 0x3f));
      uVar14 = (ulong)((int)uVar14 + (int)lVar4 + 1);
    }
    else {
      uVar14 = (uVar14 & 0xffffffff) + lVar4;
    }
    iVar9 = iVar9 + 2;
    n = n + iVar2;
    iVar3 = iVar3 + iVar2;
  }
  if (iVar9 < nx) {
    lVar4 = lVar7 << 0x20;
    puVar5 = b + lVar16;
    lVar16 = lVar16 << 0x20;
    for (lVar6 = 0; (int)lVar6 < ny + -1; lVar6 = lVar6 + 2) {
      *puVar5 = (uchar)((long)(a[lVar7 + lVar6] << 3 & uVar11 | a[lVar7 + lVar6 + 1] << 2 & uVar10)
                       >> (bVar1 & 0x3f));
      lVar4 = lVar4 + 0x200000000;
      lVar16 = lVar16 + 0x100000000;
      puVar5 = puVar5 + 1;
    }
    if ((int)lVar6 < ny) {
      b[lVar16 >> 0x20] =
           (uchar)((long)(*(long *)((long)a + (lVar4 >> 0x1d)) << 3 & uVar11) >> (bVar1 & 0x3f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit64(LONGLONG a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
LONGLONG b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = ((LONGLONG) 1)<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
}